

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetB.c
# Opt level: O0

void point_double(pt_prj_t_conflict3 *Q,pt_prj_t_conflict3 *P)

{
  limb_t *Z3;
  limb_t *Y3;
  limb_t *X3;
  limb_t *Z;
  limb_t *Y;
  limb_t *X;
  limb_t *b;
  fe_t_conflict2 t4;
  fe_t_conflict2 t3;
  fe_t_conflict2 t2;
  fe_t_conflict2 t1;
  fe_t_conflict2 t0;
  uint64_t *in_stack_00001158;
  uint64_t *in_stack_00001160;
  uint64_t *in_stack_00001168;
  uint64_t *in_stack_00001170;
  uint64_t *in_stack_ffffffffffffff70;
  uint64_t *in_stack_ffffffffffffff78;
  uint64_t *in_stack_ffffffffffffff80;
  uint64_t *in_stack_ffffffffffffffb0;
  uint64_t *in_stack_ffffffffffffffb8;
  uint64_t *in_stack_ffffffffffffffc0;
  
  fiat_id_tc26_gost_3410_2012_512_paramSetB_square(in_stack_00001160,in_stack_00001158);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_square(in_stack_00001160,in_stack_00001158);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_square(in_stack_00001160,in_stack_00001158);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_00001170,in_stack_00001168,in_stack_00001160);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_00001170,in_stack_00001168,in_stack_00001160);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_00001170,in_stack_00001168,in_stack_00001160);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_00001170,in_stack_00001168,in_stack_00001160);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_sub
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_sub
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_00001170,in_stack_00001168,in_stack_00001160);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_00001170,in_stack_00001168,in_stack_00001160);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_00001170,in_stack_00001168,in_stack_00001160);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_sub
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_sub
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_sub
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_00001170,in_stack_00001168,in_stack_00001160);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_00001170,in_stack_00001168,in_stack_00001160);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_sub
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_mul
            (in_stack_00001170,in_stack_00001168,in_stack_00001160);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_add
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  return;
}

Assistant:

static void point_double(pt_prj_t *Q, const pt_prj_t *P) {
    /* temporary variables */
    fe_t t0, t1, t2, t3, t4;
    /* constants */
    const limb_t *b = const_b;
    /* set pointers for legacy curve arith */
    const limb_t *X = P->X;
    const limb_t *Y = P->Y;
    const limb_t *Z = P->Z;
    limb_t *X3 = Q->X;
    limb_t *Y3 = Q->Y;
    limb_t *Z3 = Q->Z;

    /* the curve arith formula */
    fiat_id_tc26_gost_3410_2012_512_paramSetB_square(t0, X);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_square(t1, Y);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_square(t2, Z);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(t3, X, Y);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_add(t3, t3, t3);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(t4, Y, Z);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(Z3, X, Z);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_add(Z3, Z3, Z3);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(Y3, b, t2);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_sub(Y3, Y3, Z3);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_add(X3, Y3, Y3);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_add(Y3, X3, Y3);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_sub(X3, t1, Y3);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_add(Y3, t1, Y3);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(Y3, X3, Y3);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(X3, X3, t3);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_add(t3, t2, t2);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_add(t2, t2, t3);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(Z3, b, Z3);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_sub(Z3, Z3, t2);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_sub(Z3, Z3, t0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_add(t3, Z3, Z3);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_add(Z3, Z3, t3);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_add(t3, t0, t0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_add(t0, t3, t0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_sub(t0, t0, t2);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(t0, t0, Z3);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_add(Y3, Y3, t0);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_add(t0, t4, t4);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(Z3, t0, Z3);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_sub(X3, X3, Z3);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(Z3, t0, t1);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_add(Z3, Z3, Z3);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_add(Z3, Z3, Z3);
}